

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O3

int sptk::world::anon_unknown_5::GetBoundaryList(double *f0,int f0_length,int *boundary_list)

{
  undefined4 *puVar1;
  ulong uVar2;
  int iVar3;
  
  uVar2 = 0xffffffffffffffff;
  if (-1 < f0_length) {
    uVar2 = (long)f0_length * 4;
  }
  puVar1 = (undefined4 *)operator_new__(uVar2);
  if (f0_length < 1) {
    iVar3 = 0;
  }
  else {
    uVar2 = 0;
    do {
      puVar1[uVar2] = (uint)(0.0 < f0[uVar2]);
      uVar2 = uVar2 + 1;
    } while ((uint)f0_length != uVar2);
    iVar3 = 0;
    puVar1[(long)f0_length + -1] = 0;
    *puVar1 = 0;
    if (f0_length != 1) {
      iVar3 = 0;
      uVar2 = 1;
      do {
        if (puVar1[uVar2] != puVar1[uVar2 - 1]) {
          boundary_list[iVar3] = ((iVar3 - (iVar3 >> 0x1f) & 0xfffffffeU) - iVar3) + (int)uVar2;
          iVar3 = iVar3 + 1;
        }
        uVar2 = uVar2 + 1;
      } while ((uint)f0_length != uVar2);
    }
  }
  operator_delete__(puVar1);
  return iVar3;
}

Assistant:

static int GetBoundaryList(const double *f0, int f0_length,
    int *boundary_list) {
  int number_of_boundaries = 0;
  int *vuv = new int[f0_length];
  for (int i = 0; i < f0_length; ++i)
    vuv[i] = f0[i] > 0 ? 1 : 0;
  vuv[0] = vuv[f0_length - 1] = 0;

  for (int i = 1; i < f0_length; ++i)
    if (vuv[i] - vuv[i - 1] != 0) {
      boundary_list[number_of_boundaries] = i - number_of_boundaries % 2;
      number_of_boundaries++;
    }

  delete[] vuv;
  return number_of_boundaries;
}